

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::parseAsContents(QPDFObjectHandle *this,ParserCallbacks *callbacks)

{
  element_type *peVar1;
  QPDFObjGen local_60;
  string description;
  string local_38;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_60.obj = 0;
    local_60.gen = 0;
  }
  else {
    local_60 = peVar1->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&local_38,&local_60,' ');
  std::operator+(&description,"object ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  parseContentStream_internal(this,&description,callbacks);
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
QPDFObjectHandle::parseAsContents(ParserCallbacks* callbacks)
{
    std::string description = "object " + getObjGen().unparse(' ');
    this->parseContentStream_internal(description, callbacks);
}